

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV1ObjectBlock(Parser *this,BaseNode *node)

{
  byte bVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *out;
  char *pcVar6;
  byte *pbVar7;
  int iVar8;
  
  iVar8 = 0;
LAB_003a18d5:
  pbVar7 = (byte *)this->filePtr;
  bVar1 = *pbVar7;
  if (bVar1 < 0x7b) {
    if (bVar1 != 0x2a) {
      if (bVar1 == 0) {
        return;
      }
      goto LAB_003a1a12;
    }
    this->filePtr = (char *)(pbVar7 + 1);
    iVar4 = strncmp("NODE_NAME",(char *)(pbVar7 + 1),9);
    if (iVar4 == 0) {
      bVar1 = pbVar7[10];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_003a1928;
      if (bVar1 == 0) {
        pbVar7 = pbVar7 + 10;
      }
      else {
        pbVar7 = pbVar7 + 0xb;
      }
      this->filePtr = (char *)pbVar7;
      pcVar6 = "*NODE_NAME";
      out = &node->mName;
LAB_003a1b48:
      bVar3 = ParseString(this,out,pcVar6);
      if (!bVar3) {
        SkipToNextToken(this);
      }
      goto LAB_003a18d5;
    }
LAB_003a1928:
    pcVar6 = this->filePtr;
    iVar4 = strncmp("NODE_PARENT",pcVar6,0xb);
    if (iVar4 == 0) {
      bVar1 = pcVar6[0xb];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 0xb;
        }
        else {
          pcVar6 = pcVar6 + 0xc;
        }
        this->filePtr = pcVar6;
        pcVar6 = "*NODE_PARENT";
        out = &node->mParent;
        goto LAB_003a1b48;
      }
    }
    pcVar6 = this->filePtr;
    iVar4 = strncmp("NODE_TM",pcVar6,7);
    if (iVar4 == 0) {
      bVar1 = pcVar6[7];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 7;
        }
        else {
          pcVar6 = pcVar6 + 8;
        }
        this->filePtr = pcVar6;
        ParseLV2NodeTransformBlock(this,node);
        goto LAB_003a18d5;
      }
    }
    pcVar6 = this->filePtr;
    iVar4 = strncmp("TM_ANIMATION",pcVar6,0xc);
    if (iVar4 == 0) {
      bVar1 = pcVar6[0xc];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 0xc;
        }
        else {
          pcVar6 = pcVar6 + 0xd;
        }
        this->filePtr = pcVar6;
        ParseLV2AnimationBlock(this,node);
        goto LAB_003a18d5;
      }
    }
    TVar2 = node->mType;
    if (TVar2 == Mesh) {
      pcVar6 = this->filePtr;
      iVar4 = strncmp("MESH",pcVar6,4);
      if (iVar4 == 0) {
        bVar1 = pcVar6[4];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003a1c0b;
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 4;
        }
        else {
          pcVar6 = pcVar6 + 5;
        }
LAB_003a1ded:
        this->filePtr = pcVar6;
        ParseLV2MeshBlock(this,(Mesh *)&node[-1].mTargetAnim.akeyRotations.
                                        super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                                        _M_impl.super__Vector_impl_data._M_finish);
        goto LAB_003a18d5;
      }
LAB_003a1c0b:
      pcVar6 = this->filePtr;
      iVar4 = strncmp("MESH_SOFTSKIN",pcVar6,0xd);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0xd];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          if (bVar1 == 0) {
            pcVar6 = pcVar6 + 0xd;
          }
          else {
            pcVar6 = pcVar6 + 0xe;
          }
          goto LAB_003a1ded;
        }
      }
      pcVar6 = this->filePtr;
      iVar4 = strncmp("MATERIAL_REF",pcVar6,0xc);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0xc];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003a1a12;
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 0xc;
        }
        else {
          pcVar6 = pcVar6 + 0xd;
        }
        this->filePtr = pcVar6;
        ParseLV4MeshLong(this,(uint *)&node[1].mTargetAnim.akeyRotations);
        goto LAB_003a18d5;
      }
    }
    else if (TVar2 == Camera) {
      pcVar6 = this->filePtr;
      iVar4 = strncmp("CAMERA_SETTINGS",pcVar6,0xf);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          if (bVar1 == 0) {
            pcVar6 = pcVar6 + 0xf;
          }
          else {
            pcVar6 = pcVar6 + 0x10;
          }
          this->filePtr = pcVar6;
          ParseLV2CameraSettingsBlock(this,(Camera *)node);
          goto LAB_003a18d5;
        }
      }
      pcVar6 = this->filePtr;
      iVar4 = strncmp("CAMERA_TYPE",pcVar6,0xb);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0xb];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          if (bVar1 == 0) {
            pcVar6 = pcVar6 + 0xb;
          }
          else {
            pcVar6 = pcVar6 + 0xc;
          }
          this->filePtr = pcVar6;
          iVar4 = strncasecmp("target",pcVar6,6);
          if (iVar4 == 0) {
            *(undefined4 *)&node[1].mName._M_dataplus._M_p = 1;
          }
          else {
            iVar4 = strncasecmp("free",pcVar6,4);
            if (iVar4 == 0) {
              *(undefined4 *)&node[1].mName._M_dataplus._M_p = 0;
            }
            else {
              LogWarning(this,"Unknown kind of camera");
            }
          }
          goto LAB_003a18d5;
        }
      }
    }
    else if (TVar2 == Light) {
      pcVar6 = this->filePtr;
      iVar4 = strncmp("LIGHT_SETTINGS",pcVar6,0xe);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          if (bVar1 == 0) {
            pcVar6 = pcVar6 + 0xe;
          }
          else {
            pcVar6 = pcVar6 + 0xf;
          }
          this->filePtr = pcVar6;
          ParseLV2LightSettingsBlock(this,(Light *)node);
          goto LAB_003a18d5;
        }
      }
      pcVar6 = this->filePtr;
      iVar4 = strncmp("LIGHT_TYPE",pcVar6,10);
      if (iVar4 == 0) {
        bVar1 = pcVar6[10];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003a1a12;
        if (bVar1 == 0) {
          pcVar6 = pcVar6 + 10;
        }
        else {
          pcVar6 = pcVar6 + 0xb;
        }
        this->filePtr = pcVar6;
        iVar4 = strncasecmp("omni",pcVar6,4);
        if (iVar4 == 0) {
          *(undefined4 *)&node->field_0x154 = 0;
        }
        else {
          iVar4 = strncasecmp("target",pcVar6,6);
          if (iVar4 == 0) {
            *(undefined4 *)&node->field_0x154 = 1;
          }
          else {
            iVar4 = strncasecmp("free",pcVar6,4);
            if (iVar4 == 0) {
              *(undefined4 *)&node->field_0x154 = 2;
            }
            else {
              iVar4 = ASSIMP_strincmp("directional",pcVar6,0xb);
              if (iVar4 == 0) {
                *(undefined4 *)&node->field_0x154 = 3;
              }
              else {
                LogWarning(this,"Unknown kind of light source");
              }
            }
          }
        }
        goto LAB_003a18d5;
      }
    }
  }
  else if (bVar1 == 0x7b) {
    iVar8 = iVar8 + 1;
  }
  else if (bVar1 == 0x7d) {
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      this->filePtr = (char *)(pbVar7 + 1);
      SkipToNextToken(this);
      return;
    }
  }
LAB_003a1a12:
  uVar5 = (uint)(byte)*this->filePtr;
  if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) && (this->bLastWasEndLine == false))
  {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = this->filePtr + 1;
  goto LAB_003a18d5;
}

Assistant:

void Parser::ParseLV1ObjectBlock(ASE::BaseNode& node)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // first process common tokens such as node name and transform
            // name of the mesh/node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                if(!ParseString(node.mName,"*NODE_NAME"))
                    SkipToNextToken();
                continue;
            }
            // name of the parent of the node
            if (TokenMatch(filePtr,"NODE_PARENT" ,11) )
            {
                if(!ParseString(node.mParent,"*NODE_PARENT"))
                    SkipToNextToken();
                continue;
            }
            // transformation matrix of the node
            if (TokenMatch(filePtr,"NODE_TM" ,7))
            {
                ParseLV2NodeTransformBlock(node);
                continue;
            }
            // animation data of the node
            if (TokenMatch(filePtr,"TM_ANIMATION" ,12))
            {
                ParseLV2AnimationBlock(node);
                continue;
            }

            if (node.mType == BaseNode::Light)
            {
                // light settings
                if (TokenMatch(filePtr,"LIGHT_SETTINGS" ,14))
                {
                    ParseLV2LightSettingsBlock((ASE::Light&)node);
                    continue;
                }
                // type of the light source
                if (TokenMatch(filePtr,"LIGHT_TYPE" ,10))
                {
                    if (!ASSIMP_strincmp("omni",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::OMNI;
                    }
                    else if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::FREE;
                    }
                    else if (!ASSIMP_strincmp("directional",filePtr,11))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::DIRECTIONAL;
                    }
                    else
                    {
                        LogWarning("Unknown kind of light source");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Camera)
            {
                // Camera settings
                if (TokenMatch(filePtr,"CAMERA_SETTINGS" ,15))
                {
                    ParseLV2CameraSettingsBlock((ASE::Camera&)node);
                    continue;
                }
                else if (TokenMatch(filePtr,"CAMERA_TYPE" ,11))
                {
                    if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::FREE;
                    }
                    else
                    {
                        LogWarning("Unknown kind of camera");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Mesh)
            {
                // mesh data
                // FIX: Older files use MESH_SOFTSKIN
                if (TokenMatch(filePtr,"MESH" ,4) ||
                    TokenMatch(filePtr,"MESH_SOFTSKIN",13))
                {
                    ParseLV2MeshBlock((ASE::Mesh&)node);
                    continue;
                }
                // mesh material index
                if (TokenMatch(filePtr,"MATERIAL_REF" ,12))
                {
                    ParseLV4MeshLong(((ASE::Mesh&)node).iMaterialIndex);
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}